

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

void __thiscall
llvm::cl::generic_parser_base::printOptionInfo
          (generic_parser_base *this,Option *O,size_t GlobalWidth)

{
  uint uVar1;
  int iVar2;
  raw_ostream *prVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  int extraout_EDX;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  char *extraout_RDX_02;
  size_t in_R8;
  uint uVar4;
  StringRef HelpStr;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef HelpStr_00;
  
  if ((O->ArgStr).Length == 0) {
    if ((O->HelpStr).Length != 0) {
      prVar3 = outs();
      prVar3 = raw_ostream::operator<<(prVar3,"  ");
      prVar3 = raw_ostream::operator<<(prVar3,O->HelpStr);
      raw_ostream::operator<<(prVar3,'\n');
    }
    uVar1 = (*this->_vptr_generic_parser_base[2])(this);
    for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
      iVar2 = (*this->_vptr_generic_parser_base[3])(this,(ulong)uVar4);
      Str_01.Data._4_4_ = extraout_var_01;
      Str_01.Data._0_4_ = iVar2;
      prVar3 = outs();
      prVar3 = raw_ostream::operator<<(prVar3,"    -");
      Str_01.Length = extraout_RDX_01;
      raw_ostream::operator<<(prVar3,Str_01);
      iVar2 = (*this->_vptr_generic_parser_base[4])(this,(ulong)uVar4);
      HelpStr_00.Length = GlobalWidth;
      HelpStr_00.Data = extraout_RDX_02;
      Option::printHelpStr
                ((Option *)CONCAT44(extraout_var_02,iVar2),HelpStr_00,extraout_RDX_01 + 8,in_R8);
    }
  }
  else {
    prVar3 = outs();
    prVar3 = raw_ostream::operator<<(prVar3,"  -");
    raw_ostream::operator<<(prVar3,O->ArgStr);
    HelpStr.Length = GlobalWidth;
    HelpStr.Data = (char *)(O->HelpStr).Length;
    Option::printHelpStr((Option *)(O->HelpStr).Data,HelpStr,(O->ArgStr).Length + 6,in_R8);
    uVar1 = (*this->_vptr_generic_parser_base[2])(this);
    for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
      (*this->_vptr_generic_parser_base[3])(this,(ulong)uVar4);
      prVar3 = outs();
      prVar3 = raw_ostream::operator<<(prVar3,"    =");
      iVar2 = (*this->_vptr_generic_parser_base[3])(this,(ulong)uVar4);
      Str.Data._4_4_ = extraout_var;
      Str.Data._0_4_ = iVar2;
      Str.Length = extraout_RDX;
      raw_ostream::operator<<(prVar3,Str);
      prVar3 = outs();
      prVar3 = raw_ostream::indent(prVar3,((int)GlobalWidth - extraout_EDX) - 8);
      prVar3 = raw_ostream::operator<<(prVar3," -   ");
      iVar2 = (*this->_vptr_generic_parser_base[4])(this,(ulong)uVar4);
      Str_00.Data._4_4_ = extraout_var_00;
      Str_00.Data._0_4_ = iVar2;
      Str_00.Length = extraout_RDX_00;
      prVar3 = raw_ostream::operator<<(prVar3,Str_00);
      raw_ostream::operator<<(prVar3,'\n');
    }
  }
  return;
}

Assistant:

void generic_parser_base::printOptionInfo(const Option &O,
                                          size_t GlobalWidth) const {
  if (O.hasArgStr()) {
    outs() << "  -" << O.ArgStr;
    Option::printHelpStr(O.HelpStr, GlobalWidth, O.ArgStr.size() + 6);

    for (unsigned i = 0, e = getNumOptions(); i != e; ++i) {
      size_t NumSpaces = GlobalWidth - getOption(i).size() - 8;
      outs() << "    =" << getOption(i);
      outs().indent(NumSpaces) << " -   " << getDescription(i) << '\n';
    }
  } else {
    if (!O.HelpStr.empty())
      outs() << "  " << O.HelpStr << '\n';
    for (unsigned i = 0, e = getNumOptions(); i != e; ++i) {
      auto Option = getOption(i);
      outs() << "    -" << Option;
      Option::printHelpStr(getDescription(i), GlobalWidth, Option.size() + 8);
    }
  }
}